

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMesh::GetEdgeCenterPointAndNormal
          (ON_SubDMesh *this,ON_SubDEdge *edge,uint edge_face_index,double *P,double *N)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_SubDFace *this_00;
  ON_SubDEdge *pOVar5;
  ON_SubDVertex *pOVar6;
  ON__UINT_PTR OVar7;
  ON_SubDVertex *pOVar8;
  double *pdVar9;
  double *pdVar10;
  bool bVar11;
  ON_SubDMeshFragment *local_b0;
  double *fragment_N;
  double *fragment_P;
  uint evi;
  ON_SubDVertex *v;
  uint n;
  ON_SubDEdge *grid_side_edge;
  ON_SubDMeshFragment *pOStack_58;
  uint grid_side_index;
  ON_SubDMeshFragment *fragment;
  uint local_48;
  bool bIsPartialFragment;
  uint P_dex;
  uint fei;
  ON_SubDFace *face;
  double *N_local;
  double *P_local;
  uint edge_face_index_local;
  ON_SubDEdge *edge_local;
  ON_SubDMesh *this_local;
  
  if (P != (double *)0x0) {
    *P = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (N != (double *)0x0) {
    *N = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  if (edge == (ON_SubDEdge *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = ON_SubDEdge::Face(edge,edge_face_index);
    if (this_00 == (ON_SubDFace *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      uVar3 = ON_SubDFace::EdgeArrayIndex(this_00,edge);
      uVar4 = ON_SubDFace::EdgeCount(this_00);
      if (uVar3 < uVar4) {
        local_48 = 0xffffffff;
        pOStack_58 = FaceFragment(this,this_00);
        while( true ) {
          bVar11 = false;
          if (pOStack_58 != (ON_SubDMeshFragment *)0x0) {
            bVar11 = pOStack_58->m_face == this_00;
          }
          if (!bVar11) break;
          bVar11 = ON_SubDMeshFragment::IsFaceCornerFragment(pOStack_58);
          for (grid_side_edge._4_4_ = 0; grid_side_edge._4_4_ < 4;
              grid_side_edge._4_4_ = grid_side_edge._4_4_ + 1) {
            pOVar5 = ON_SubDMeshFragment::SubDEdge(pOStack_58,grid_side_edge._4_4_);
            if (edge == pOVar5) {
              bVar1 = (pOStack_58->m_grid).m_side_segment_count;
              uVar4 = (uint)bVar1;
              if ((uVar4 != 0) && ((pOStack_58->m_grid).m_S != (uint *)0x0)) {
                if (bVar11) {
                  pOVar6 = ON_SubDMeshFragment::SubDVertex(pOStack_58,grid_side_edge._4_4_);
                  if (pOVar6 != (ON_SubDVertex *)0x0) {
                    OVar7 = ON_SubDFace::EdgeDirection(this_00,uVar3);
                    pOVar8 = ON_SubDEdge::Vertex(edge,(uint)(OVar7 != 0));
                    if (pOVar6 == pOVar8) {
                      grid_side_edge._4_4_ = grid_side_edge._4_4_ + 1;
                    }
                    local_48 = (pOStack_58->m_grid).m_S[grid_side_edge._4_4_ * uVar4];
                  }
                }
                else {
                  bVar2 = ON_SubDMeshFragment::IsFullFaceFragment(pOStack_58);
                  if (bVar2) {
                    local_48 = (pOStack_58->m_grid).m_S
                               [grid_side_edge._4_4_ * uVar4 + (uint)(bVar1 >> 1)];
                  }
                }
              }
              break;
            }
          }
          if ((!bVar11) || (local_48 != 0xffffffff)) break;
          if (bVar11) {
            local_b0 = pOStack_58->m_next_fragment;
          }
          else {
            local_b0 = (ON_SubDMeshFragment *)0x0;
          }
          pOStack_58 = local_b0;
        }
        if (pOStack_58 == (ON_SubDMeshFragment *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          uVar3 = ON_SubDMeshFragment::PointCount(pOStack_58);
          if (local_48 < uVar3) {
            pdVar9 = pOStack_58->m_P + (ulong)local_48 * pOStack_58->m_P_stride;
            pdVar10 = pOStack_58->m_N + (ulong)local_48 * pOStack_58->m_N_stride;
            if (P != (double *)0x0) {
              *P = *pdVar9;
              P[1] = pdVar9[1];
              P[2] = pdVar9[2];
            }
            if (N != (double *)0x0) {
              *N = *pdVar10;
              N[1] = pdVar10[1];
              N[2] = pdVar10[2];
            }
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMesh::GetEdgeCenterPointAndNormal(
  const class ON_SubDEdge* edge,
  unsigned int edge_face_index,
  double* P,
  double* N
) const
{
  if (nullptr != P)
  {
    P[0] = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (nullptr != N)
  {
    N[0] = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  if (nullptr == edge)
    return false;
  const ON_SubDFace* face = edge->Face(edge_face_index);
  if (nullptr == face)
    return false;
  const unsigned int fei = face->EdgeArrayIndex(edge);
  if (fei >= face->EdgeCount())
    return false;

  unsigned int P_dex = ON_UNSET_UINT_INDEX;

  bool bIsPartialFragment = false;
  const ON_SubDMeshFragment* fragment = nullptr;
  for (
    fragment =  FaceFragment(face);
    nullptr != fragment && fragment->m_face == face;
    fragment = bIsPartialFragment ? fragment->m_next_fragment : nullptr
    )
  {
    bIsPartialFragment = fragment->IsFaceCornerFragment();
    for (unsigned int grid_side_index = 0; grid_side_index < 4; grid_side_index++)
    {
      const ON_SubDEdge* grid_side_edge = fragment->SubDEdge(grid_side_index);
      if (edge != grid_side_edge)
        continue;
      const unsigned int n = fragment->m_grid.m_side_segment_count;
      if (n <= 0 || nullptr == fragment->m_grid.m_S)
        break;
      if (bIsPartialFragment)
      {
        const ON_SubDVertex* v = fragment->SubDVertex(grid_side_index);
        if (nullptr != v)
        {
          const unsigned int evi = (0 == face->EdgeDirection(fei)) ? 0U : 1U;
          if (v == edge->Vertex(evi))
            grid_side_index++;
          P_dex = fragment->m_grid.m_S[grid_side_index*n];
        }
      }
      else if (fragment->IsFullFaceFragment())
      {
        P_dex = fragment->m_grid.m_S[grid_side_index*n + n / 2];
      }
      break;
    }
    if (false == bIsPartialFragment || ON_UNSET_UINT_INDEX != P_dex)
      break;
  }
  if (nullptr == fragment)
    return false;
  if (P_dex >= fragment->PointCount())
    return false;
  const double* fragment_P = fragment->m_P + (P_dex * fragment->m_P_stride);
  const double* fragment_N = fragment->m_N + (P_dex * fragment->m_N_stride);
  if (nullptr != P)
  {
    P[0] = fragment_P[0];
    P[1] = fragment_P[1];
    P[2] = fragment_P[2];
  }
  if (nullptr != N)
  {
    N[0] = fragment_N[0];
    N[1] = fragment_N[1];
    N[2] = fragment_N[2];
  }
  return true;
}